

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O2

void anon_unknown.dwarf_7fba::test_art_is_empty(void **param_1)

{
  _Bool _Var1;
  allocator_type *__a;
  initializer_list<const_char_*> __l;
  initializer_list<(anonymous_namespace)::Value> __l_00;
  art_t art;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> values;
  vector<const_char_*,_std::allocator<const_char_*>_> keys;
  Value val;
  
  val._0_8_ = anon_var_dwarf_157;
  val.val = (uint64_t)anon_var_dwarf_16d;
  __a = (allocator_type *)&values;
  __l._M_len = 5;
  __l._M_array = (iterator)&val;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&keys,__l,__a);
  val.val = 1;
  __l_00._M_len = 5;
  __l_00._M_array = &val;
  std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::vector
            (&values,__l_00,(allocator_type *)__a);
  art.root = (art_node_t *)0x0;
  assert_art_valid(&art);
  _Var1 = art_is_empty((art_t *)&art);
  _assert_true((ulong)_Var1,"art_is_empty(&art)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0xcd);
  val.val = 1;
  art_insert((art_t *)&art,(art_key_chunk_t *)"000001",(art_val_t *)&val);
  assert_art_valid(&art);
  _Var1 = art_is_empty((art_t *)&art);
  _assert_true((ulong)!_Var1,"art_is_empty(&art)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0xd2);
  art_free((art_t *)&art);
  std::_Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::
  ~_Vector_base(&values.
                 super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
               );
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  return;
}

Assistant:

DEFINE_TEST(test_art_is_empty) {
    std::vector<const char*> keys = {
        "000001", "000002", "000003", "000004", "001005",
    };
    std::vector<Value> values = {{1}, {2}, {3}, {4}, {5}};

    art_t art{NULL};
    assert_art_valid(&art);
    assert_true(art_is_empty(&art));
    const char* key = "000001";
    Value val{1};
    art_insert(&art, (art_key_chunk_t*)key, &val);
    assert_art_valid(&art);
    assert_false(art_is_empty(&art));
    art_free(&art);
}